

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StaticGraphics.c
# Opt level: O0

void plot_static_tiles(tgestate_t *state,uint8_t *out,statictileline_t *stline,int orientation)

{
  uint8_t *puVar1;
  uint uVar2;
  uint width;
  long lVar3;
  int in_ECX;
  byte *start;
  long in_RDX;
  uint8_t *in_RSI;
  tgestate_t *in_RDI;
  int aoffset;
  ptrdiff_t soffset;
  int iters;
  tilerow_t *tile_data;
  static_tile_t *static_tile;
  int tile_index;
  uint8_t *tiles;
  int tiles_remaining;
  uint8_t *saved_out;
  uint local_64;
  int local_54;
  static_tile_t *local_50;
  int in_stack_ffffffffffffffc0;
  byte *pbVar4;
  undefined4 in_stack_ffffffffffffffd0;
  uint8_t *local_10;
  
  uVar2 = *(byte *)(in_RDX + 2) & 0xffffff7f;
  pbVar4 = *(byte **)(in_RDX + 8);
  local_10 = in_RSI;
  do {
    start = pbVar4 + 1;
    width = (uint)*pbVar4;
    local_54 = 8;
    local_50 = static_tiles + (int)width;
    puVar1 = local_10;
    do {
      local_10 = puVar1;
      *local_10 = (local_50->data).row[0];
      local_54 = local_54 + -1;
      local_50 = (static_tile_t *)((local_50->data).row + 1);
      puVar1 = local_10 + 0x100;
    } while (local_54 != 0);
    lVar3 = (long)local_10 - (long)(in_RDI->speccy->screen).pixels;
    local_64 = (uint)lVar3 & 0xff;
    if (0x7ff < lVar3) {
      local_64 = local_64 + 0x100;
    }
    if (0xfff < lVar3) {
      local_64 = local_64 + 0x100;
    }
    (in_RDI->speccy->screen).attributes[(int)local_64] = static_tiles[(int)width].attr;
    if (in_ECX == 0) {
      local_10 = local_10 + -0x6ff;
    }
    else {
      local_10 = get_next_scanline(in_RDI,local_10);
    }
    uVar2 = uVar2 - 1;
    pbVar4 = start;
  } while (uVar2 != 0);
  if (in_ECX == 0) {
    invalidate_bitmap((tgestate_t *)
                      ((ulong)CONCAT14(*(undefined1 *)(in_RDX + 2),in_stack_ffffffffffffffd0) &
                      0xffffff7fffffffff),start,width,in_stack_ffffffffffffffc0);
  }
  else {
    invalidate_bitmap((tgestate_t *)
                      ((ulong)CONCAT14(*(undefined1 *)(in_RDX + 2),in_stack_ffffffffffffffd0) &
                      0xffffff7fffffffff),start,width,in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

static void plot_static_tiles(tgestate_t             *state,
                              uint8_t                *out,
                              const statictileline_t *stline,
                              int                     orientation)
{
  uint8_t       *saved_out = out;

  int            tiles_remaining; /* was A/B */
  const uint8_t *tiles;           /* was HL */

  assert(state  != NULL);
  ASSERT_SCREEN_PTR_VALID(out);
  assert(stline != NULL);
  assert(orientation == 0x00 || orientation == 0xFF);

  tiles = stline->tiles;

  tiles_remaining = stline->flags_and_length & ~statictileline_MASK;
  do
  {
    int                  tile_index;  /* was A */
    const static_tile_t *static_tile; /* was HL' */
    const tilerow_t     *tile_data;   /* was HL' */
    int                  iters;       /* was B' */
    ptrdiff_t            soffset;     /* was A */
    int                  aoffset;

    tile_index = *tiles++;

    static_tile = &static_tiles[tile_index]; // elements: 9 bytes each

    /* Plot a tile. */
    tile_data = &static_tile->data.row[0];
    iters = 8;
    do
    {
      *out = *tile_data++;
      out += 256; /* move to next screen row */
    }
    while (--iters);
    out -= 256;

    /* Calculate screen attribute address of tile. */
    // ((out - screen_base) / 0x800) * 0x100 + attr_base
    soffset = out - &state->speccy->screen.pixels[0];
    aoffset = soffset & 0xFF;
    if (soffset >= 0x0800) aoffset += 256;
    if (soffset >= 0x1000) aoffset += 256;
    state->speccy->screen.attributes[aoffset] = static_tile->attr; /* Copy attribute byte. */

    if (orientation == 0) /* Horizontal */
      out = out - 7 * 256 + 1;
    else /* Vertical */
      out = (uint8_t *) get_next_scanline(state, out); // must cast away constness

    ASSERT_SCREEN_PTR_VALID(out);
  }
  while (--tiles_remaining);

  /* Conv: Invalidation added over the original game. */
  tiles_remaining = stline->flags_and_length & ~statictileline_MASK;
  if (orientation == 0) /* Horizontal */
    invalidate_bitmap(state, saved_out, tiles_remaining * 8, 8);
  else
    invalidate_bitmap(state, saved_out, 8, tiles_remaining * 8);
}